

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O0

int coda_grib_cursor_goto_array_element_by_index(coda_cursor_conflict *cursor,long index)

{
  coda_dynamic_type_struct *pcVar1;
  long *in_FS_OFFSET;
  coda_grib_value_array *type;
  long index_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if ((*(int *)(*in_FS_OFFSET + -0x1208) == 0) || ((-1 < index && (index < *(long *)(pcVar1 + 1)))))
  {
    cursor->n = cursor->n + 1;
    cursor->stack[cursor->n + -1].type = (coda_dynamic_type_struct *)pcVar1[1].definition;
    cursor->stack[cursor->n + -1].index = index;
    cursor->stack[cursor->n + -1].bit_offset = -1;
    cursor_local._4_4_ = 0;
  }
  else {
    coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld) (%s:%u)",index,
                   *(undefined8 *)(pcVar1 + 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                   ,0x54);
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_grib_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_grib_value_array *type = (coda_grib_value_array *)cursor->stack[cursor->n - 1].type;

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        if (index < 0 || index >= type->num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld) (%s:%u)",
                           index, type->num_elements, __FILE__, __LINE__);
            return -1;
        }
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].type = type->base_type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = -1;

    return 0;
}